

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

ostream * AixLog::operator<<(ostream *os,Timestamp *timestamp)

{
  bool bVar1;
  long lVar2;
  Timestamp *in_RSI;
  ostream *in_RDI;
  lock_guard<std::recursive_mutex> lock;
  Log *log;
  string *in_stack_00000120;
  Timestamp *in_stack_00000128;
  mutex_type *in_stack_ffffffffffffff58;
  lock_guard<std::recursive_mutex> *in_stack_ffffffffffffff60;
  ostream *poVar3;
  long local_88;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string local_40 [40];
  long local_18;
  Timestamp *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  lVar2 = std::ios::rdbuf();
  if (lVar2 == 0) {
    local_88 = 0;
  }
  else {
    local_88 = __dynamic_cast(lVar2,&std::streambuf::typeinfo,&Log::typeinfo,0);
  }
  local_18 = local_88;
  if (local_88 == 0) {
    bVar1 = Timestamp::operator_cast_to_bool(local_10);
    if (bVar1) {
      poVar3 = local_8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      Timestamp::to_string(in_stack_00000128,in_stack_00000120);
      std::operator<<(poVar3,local_40);
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
    }
  }
  else {
    std::lock_guard<std::recursive_mutex>::lock_guard
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    Timestamp::operator=((Timestamp *)(local_18 + 0x110),local_10);
    std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x2bd096)
    ;
  }
  return local_8;
}

Assistant:

static std::ostream& operator<<(std::ostream& os, const Timestamp& timestamp) {
  Log* log = dynamic_cast<Log*>(os.rdbuf());
  if (log != nullptr) {
    std::lock_guard<std::recursive_mutex> lock(log->mutex_);
    log->metadata_.timestamp = timestamp;
  } else if (timestamp) {
    os << timestamp.to_string();
  }
  return os;
}